

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::SolverParameter::ByteSizeLong(SolverParameter *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  SolverParameter_SolverType value;
  SolverParameter_SolverMode value_00;
  int32 iVar4;
  SolverParameter_SnapshotFormat value_01;
  UnknownFieldSet *unknown_fields;
  size_t sVar5;
  string *psVar6;
  size_t sVar7;
  NetParameter *value_02;
  NetState *value_03;
  int64 value_04;
  int cached_size;
  size_t data_size_1;
  uint i_2;
  uint count_1;
  uint i_1;
  uint count;
  size_t data_size;
  int n;
  int i;
  size_t total_size;
  SolverParameter *this_local;
  
  _n = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = SolverParameter::unknown_fields(this);
    _n = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  iVar2 = test_net_size(this);
  sVar5 = google::protobuf::internal::FromIntSize(iVar2);
  _n = sVar5 + _n;
  data_size._4_4_ = 0;
  iVar2 = test_net_size(this);
  for (; data_size._4_4_ < iVar2; data_size._4_4_ = data_size._4_4_ + 1) {
    psVar6 = test_net_abi_cxx11_(this,data_size._4_4_);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    _n = sVar5 + _n;
  }
  sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(&this->test_iter_);
  iVar2 = test_iter_size(this);
  sVar7 = google::protobuf::internal::FromIntSize(iVar2);
  uVar3 = test_net_param_size(this);
  _n = (ulong)uVar3 * 2 + sVar5 + sVar7 + _n;
  for (i_2 = 0; i_2 < uVar3; i_2 = i_2 + 1) {
    value_02 = test_net_param(this,i_2);
    sVar5 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::NetParameter>
                      (value_02);
    _n = sVar5 + _n;
  }
  uVar3 = test_state_size(this);
  _n = (ulong)uVar3 * 2 + _n;
  for (data_size_1._0_4_ = 0; (uint)data_size_1 < uVar3; data_size_1._0_4_ = (uint)data_size_1 + 1)
  {
    value_03 = test_state(this,(uint)data_size_1);
    sVar5 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::NetState>
                      (value_03);
    _n = sVar5 + _n;
  }
  sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(&this->stepvalue_);
  iVar2 = stepvalue_size(this);
  sVar7 = google::protobuf::internal::FromIntSize(iVar2);
  _n = sVar5 + sVar7 * 2 + _n;
  if (((this->_has_bits_).has_bits_[0] & 0xff) != 0) {
    bVar1 = has_train_net(this);
    if (bVar1) {
      psVar6 = train_net_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _n = sVar5 + 1 + _n;
    }
    bVar1 = has_lr_policy(this);
    if (bVar1) {
      psVar6 = lr_policy_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _n = sVar5 + 1 + _n;
    }
    bVar1 = has_snapshot_prefix(this);
    if (bVar1) {
      psVar6 = snapshot_prefix_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _n = sVar5 + 1 + _n;
    }
    bVar1 = has_net(this);
    if (bVar1) {
      psVar6 = net_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _n = sVar5 + 2 + _n;
    }
    bVar1 = has_regularization_type(this);
    if (bVar1) {
      psVar6 = regularization_type_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _n = sVar5 + 2 + _n;
    }
    bVar1 = has_type(this);
    if (bVar1) {
      psVar6 = type_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _n = sVar5 + 2 + _n;
    }
    bVar1 = has_train_net_param(this);
    if (bVar1) {
      sVar5 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::NetParameter>
                        (this->train_net_param_);
      _n = sVar5 + 2 + _n;
    }
    bVar1 = has_net_param(this);
    if (bVar1) {
      sVar5 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::NetParameter>
                        (this->net_param_);
      _n = sVar5 + 2 + _n;
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 0xff00) != 0) {
    bVar1 = has_train_state(this);
    if (bVar1) {
      sVar5 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::NetState>
                        (this->train_state_);
      _n = sVar5 + 2 + _n;
    }
    bVar1 = has_test_interval(this);
    if (bVar1) {
      iVar4 = test_interval(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      _n = sVar5 + 1 + _n;
    }
    bVar1 = has_base_lr(this);
    if (bVar1) {
      _n = _n + 5;
    }
    bVar1 = has_display(this);
    if (bVar1) {
      iVar4 = display(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      _n = sVar5 + 1 + _n;
    }
    bVar1 = has_max_iter(this);
    if (bVar1) {
      iVar4 = max_iter(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      _n = sVar5 + 1 + _n;
    }
    bVar1 = has_gamma(this);
    if (bVar1) {
      _n = _n + 5;
    }
    bVar1 = has_power(this);
    if (bVar1) {
      _n = _n + 5;
    }
    bVar1 = has_momentum(this);
    if (bVar1) {
      _n = _n + 5;
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 0xff0000) != 0) {
    bVar1 = has_weight_decay(this);
    if (bVar1) {
      _n = _n + 5;
    }
    bVar1 = has_stepsize(this);
    if (bVar1) {
      iVar4 = stepsize(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      _n = sVar5 + 1 + _n;
    }
    bVar1 = has_snapshot(this);
    if (bVar1) {
      iVar4 = snapshot(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      _n = sVar5 + 1 + _n;
    }
    bVar1 = has_device_id(this);
    if (bVar1) {
      iVar4 = device_id(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      _n = sVar5 + 2 + _n;
    }
    bVar1 = has_test_compute_loss(this);
    if (bVar1) {
      _n = _n + 3;
    }
    bVar1 = has_snapshot_diff(this);
    if (bVar1) {
      _n = _n + 3;
    }
    bVar1 = has_debug_info(this);
    if (bVar1) {
      _n = _n + 3;
    }
    bVar1 = has_solver_type(this);
    if (bVar1) {
      value = solver_type(this);
      sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(value);
      _n = sVar5 + 2 + _n;
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 0xff000000) != 0) {
    bVar1 = has_momentum2(this);
    if (bVar1) {
      _n = _n + 6;
    }
    bVar1 = has_random_seed(this);
    if (bVar1) {
      value_04 = random_seed(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int64Size(value_04);
      _n = sVar5 + 2 + _n;
    }
    bVar1 = has_solver_mode(this);
    if (bVar1) {
      value_00 = solver_mode(this);
      sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(value_00);
      _n = sVar5 + 2 + _n;
    }
    bVar1 = has_test_initialization(this);
    if (bVar1) {
      _n = _n + 3;
    }
    bVar1 = has_snapshot_after_train(this);
    if (bVar1) {
      _n = _n + 3;
    }
    bVar1 = has_delta(this);
    if (bVar1) {
      _n = _n + 6;
    }
    bVar1 = has_average_loss(this);
    if (bVar1) {
      iVar4 = average_loss(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      _n = sVar5 + 2 + _n;
    }
    bVar1 = has_clip_gradients(this);
    if (bVar1) {
      _n = _n + 6;
    }
  }
  if (((this->_has_bits_).has_bits_[1] & 7) != 0) {
    bVar1 = has_iter_size(this);
    if (bVar1) {
      iVar4 = iter_size(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      _n = sVar5 + 2 + _n;
    }
    bVar1 = has_snapshot_format(this);
    if (bVar1) {
      value_01 = snapshot_format(this);
      sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(value_01);
      _n = sVar5 + 2 + _n;
    }
    bVar1 = has_rms_decay(this);
    if (bVar1) {
      _n = _n + 6;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(_n);
  this->_cached_size_ = iVar2;
  return _n;
}

Assistant:

size_t SolverParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.SolverParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated string test_net = 2;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->test_net_size());
  for (int i = 0, n = this->test_net_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->test_net(i));
  }

  // repeated int32 test_iter = 3;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->test_iter_);
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->test_iter_size());
    total_size += data_size;
  }

  // repeated .caffe.NetParameter test_net_param = 22;
  {
    unsigned int count = this->test_net_param_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->test_net_param(i));
    }
  }

  // repeated .caffe.NetState test_state = 27;
  {
    unsigned int count = this->test_state_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->test_state(i));
    }
  }

  // repeated int32 stepvalue = 34;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->stepvalue_);
    total_size += 2 *
                  ::google::protobuf::internal::FromIntSize(this->stepvalue_size());
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 255u) {
    // optional string train_net = 1;
    if (has_train_net()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->train_net());
    }

    // optional string lr_policy = 8;
    if (has_lr_policy()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->lr_policy());
    }

    // optional string snapshot_prefix = 15;
    if (has_snapshot_prefix()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->snapshot_prefix());
    }

    // optional string net = 24;
    if (has_net()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->net());
    }

    // optional string regularization_type = 29 [default = "L2"];
    if (has_regularization_type()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->regularization_type());
    }

    // optional string type = 40 [default = "SGD"];
    if (has_type()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->type());
    }

    // optional .caffe.NetParameter train_net_param = 21;
    if (has_train_net_param()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->train_net_param_);
    }

    // optional .caffe.NetParameter net_param = 25;
    if (has_net_param()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->net_param_);
    }

  }
  if (_has_bits_[8 / 32] & 65280u) {
    // optional .caffe.NetState train_state = 26;
    if (has_train_state()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->train_state_);
    }

    // optional int32 test_interval = 4 [default = 0];
    if (has_test_interval()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->test_interval());
    }

    // optional float base_lr = 5;
    if (has_base_lr()) {
      total_size += 1 + 4;
    }

    // optional int32 display = 6;
    if (has_display()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->display());
    }

    // optional int32 max_iter = 7;
    if (has_max_iter()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->max_iter());
    }

    // optional float gamma = 9;
    if (has_gamma()) {
      total_size += 1 + 4;
    }

    // optional float power = 10;
    if (has_power()) {
      total_size += 1 + 4;
    }

    // optional float momentum = 11;
    if (has_momentum()) {
      total_size += 1 + 4;
    }

  }
  if (_has_bits_[16 / 32] & 16711680u) {
    // optional float weight_decay = 12;
    if (has_weight_decay()) {
      total_size += 1 + 4;
    }

    // optional int32 stepsize = 13;
    if (has_stepsize()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->stepsize());
    }

    // optional int32 snapshot = 14 [default = 0];
    if (has_snapshot()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->snapshot());
    }

    // optional int32 device_id = 18 [default = 0];
    if (has_device_id()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->device_id());
    }

    // optional bool test_compute_loss = 19 [default = false];
    if (has_test_compute_loss()) {
      total_size += 2 + 1;
    }

    // optional bool snapshot_diff = 16 [default = false];
    if (has_snapshot_diff()) {
      total_size += 2 + 1;
    }

    // optional bool debug_info = 23 [default = false];
    if (has_debug_info()) {
      total_size += 2 + 1;
    }

    // optional .caffe.SolverParameter.SolverType solver_type = 30 [default = SGD];
    if (has_solver_type()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->solver_type());
    }

  }
  if (_has_bits_[24 / 32] & 4278190080u) {
    // optional float momentum2 = 39 [default = 0.999];
    if (has_momentum2()) {
      total_size += 2 + 4;
    }

    // optional int64 random_seed = 20 [default = -1];
    if (has_random_seed()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->random_seed());
    }

    // optional .caffe.SolverParameter.SolverMode solver_mode = 17 [default = GPU];
    if (has_solver_mode()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->solver_mode());
    }

    // optional bool test_initialization = 32 [default = true];
    if (has_test_initialization()) {
      total_size += 2 + 1;
    }

    // optional bool snapshot_after_train = 28 [default = true];
    if (has_snapshot_after_train()) {
      total_size += 2 + 1;
    }

    // optional float delta = 31 [default = 1e-08];
    if (has_delta()) {
      total_size += 2 + 4;
    }

    // optional int32 average_loss = 33 [default = 1];
    if (has_average_loss()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->average_loss());
    }

    // optional float clip_gradients = 35 [default = -1];
    if (has_clip_gradients()) {
      total_size += 2 + 4;
    }

  }
  if (_has_bits_[32 / 32] & 7u) {
    // optional int32 iter_size = 36 [default = 1];
    if (has_iter_size()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->iter_size());
    }

    // optional .caffe.SolverParameter.SnapshotFormat snapshot_format = 37 [default = BINARYPROTO];
    if (has_snapshot_format()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->snapshot_format());
    }

    // optional float rms_decay = 38 [default = 0.99];
    if (has_rms_decay()) {
      total_size += 2 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}